

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  uint uVar1;
  ConstPasswdProxy *this;
  
  this = (ConstPasswdProxy *)operator_new(8);
  ConstPasswdProxy::ConstPasswdProxy(this);
  uVar1 = (*(this->super_PasswordProxy)._vptr_PasswordProxy[2])(this,"abc");
  printf("result: %d\n",(ulong)(uVar1 & 0xff));
  uVar1 = (*(this->super_PasswordProxy)._vptr_PasswordProxy[2])(this,"1234");
  printf("result: %d\n",(ulong)(uVar1 & 0xff));
  (*(this->super_PasswordProxy)._vptr_PasswordProxy[1])(this);
  return 0;
}

Assistant:

int main(int argc, char** argv)
{
	PasswordProxy* proxy = new ConstPasswdProxy();

	bool verify = proxy->verify("abc");
	printf("result: %d\n", verify);

	verify = proxy->verify("1234");
	printf("result: %d\n", verify);

	delete proxy;

	return 0;
}